

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::
emplace_back<slang::ast::RandSeqProductionSymbol::Rule>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *this,Rule *args)

{
  size_type sVar1;
  pointer pRVar2;
  long lVar3;
  
  if (this->len == this->cap) {
    pRVar2 = emplaceRealloc<slang::ast::RandSeqProductionSymbol::Rule>
                       (this,this->data_ + this->len,args);
    return pRVar2;
  }
  pRVar2 = this->data_ + this->len;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pRVar2->ruleBlock).ptr = (args->ruleBlock).ptr;
    args = (Rule *)&args->prods;
    pRVar2 = (pointer)&pRVar2->prods;
  }
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }